

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

bool deqp::gls::FboUtil::checkExtensionSupport
               (ContextInfo *ctxInfo,RenderContext *ctx,string *extension)

{
  bool bVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int requiredMinor;
  int requiredMajor;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GL_",&local_49);
  bVar1 = de::beginsWith(extension,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported(ctxInfo,(extension->_M_dataplus)._M_p);
  }
  else {
    bVar1 = std::operator==(extension,"DEQP_gles3_core_compatible");
    if (bVar1) {
      requiredMajor = 0;
      requiredMinor = extraout_EDX;
    }
    else {
      bVar1 = std::operator==(extension,"DEQP_gles31_core_compatible");
      if (!bVar1) {
        return false;
      }
      requiredMajor = 1;
      requiredMinor = extraout_EDX_00;
    }
    bVar1 = detectGLESCompatibleContext(ctx,requiredMajor,requiredMinor);
  }
  return bVar1;
}

Assistant:

static bool checkExtensionSupport (const ContextInfo& ctxInfo, const RenderContext& ctx, const std::string& extension)
{
	if (de::beginsWith(extension, "GL_"))
		return ctxInfo.isExtensionSupported(extension.c_str());
	else if (extension == "DEQP_gles3_core_compatible")
		return detectGLESCompatibleContext(ctx, 3, 0);
	else if (extension == "DEQP_gles31_core_compatible")
		return detectGLESCompatibleContext(ctx, 3, 1);
	else
	{
		DE_ASSERT(false);
		return false;
	}
}